

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

type __thiscall cpp_client::Any::as<bool>(Any *this)

{
  bool bVar1;
  int iVar2;
  pointer phVar3;
  undefined4 extraout_var;
  bad_cast *this_00;
  undefined4 extraout_var_00;
  Any *this_local;
  
  phVar3 = std::unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>::
           operator->(&this->data_);
  iVar2 = (*phVar3->_vptr_holder[2])();
  bVar1 = std::type_info::operator!=
                    ((type_info *)&bool::typeinfo,(type_info *)CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    phVar3 = std::unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ::operator->(&this->data_);
    iVar2 = (*phVar3->_vptr_holder[3])();
    return (type)CONCAT44(extraout_var_00,iVar2);
  }
  this_00 = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this_00);
  __cxa_throw(this_00,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

typename std::enable_if<std::is_fundamental<T>::value || std::is_pointer<T>::value, T&>::type as()
   {
      if(typeid(T) != data_->type())
      {
         throw std::bad_cast{};
      }
      return *static_cast<T*>(data_->get());
   }